

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionsPdu.cpp
# Opt level: O1

void __thiscall
DIS::ElectromagneticEmissionsPdu::~ElectromagneticEmissionsPdu(ElectromagneticEmissionsPdu *this)

{
  pointer pEVar1;
  pointer pEVar2;
  pointer pEVar3;
  
  (this->super_DistributedEmissionsFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__ElectromagneticEmissionsPdu_0019fbd8;
  pEVar1 = (this->_systems).
           super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->_systems).
           super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pEVar3 = pEVar1;
  if (pEVar2 != pEVar1) {
    do {
      (**pEVar3->_vptr_ElectromagneticEmissionSystemData)(pEVar3);
      pEVar3 = pEVar3 + 1;
    } while (pEVar3 != pEVar2);
    (this->_systems).
    super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
    ._M_impl.super__Vector_impl_data._M_finish = pEVar1;
  }
  std::
  vector<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
  ::~vector(&this->_systems);
  EventID::~EventID(&this->_eventID);
  EntityID::~EntityID(&this->_emittingEntityID);
  DistributedEmissionsFamilyPdu::~DistributedEmissionsFamilyPdu
            (&this->super_DistributedEmissionsFamilyPdu);
  return;
}

Assistant:

ElectromagneticEmissionsPdu::~ElectromagneticEmissionsPdu()
{
    _systems.clear();
}